

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pboolean p_socket_check_connect_result(PSocket *socket,PError **error)

{
  PError **error_00;
  int iVar1;
  pint pVar2;
  PErrorIO PVar3;
  int local_28 [2];
  pint val;
  socklen_t optlen;
  PError **error_local;
  PSocket *socket_local;
  
  _val = error;
  error_local = (PError **)socket;
  if (socket == (PSocket *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local._4_4_ = 0;
  }
  else {
    local_28[1] = 4;
    iVar1 = getsockopt(socket->fd,1,4,local_28,(socklen_t *)(local_28 + 1));
    error_00 = _val;
    if (iVar1 < 0) {
      pVar2 = p_error_get_last_net();
      PVar3 = p_error_get_io_from_system(pVar2);
      pVar2 = p_error_get_last_net();
      p_error_set_error_p(error_00,PVar3,pVar2,
                          "Failed to call getsockopt() to get connection status");
      socket_local._4_4_ = 0;
    }
    else {
      if (local_28[0] != 0) {
        PVar3 = p_error_get_io_from_system(local_28[0]);
        p_error_set_error_p(error_00,PVar3,local_28[0],"Error in socket layer");
      }
      *(byte *)(error_local + 3) = *(byte *)(error_local + 3) & 0xf7 | (local_28[0] == 0) << 3;
      socket_local._4_4_ = (uint)(local_28[0] == 0);
    }
  }
  return socket_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_check_connect_result (PSocket  *socket,
			       PError	**error)
{
	socklen_t	optlen;
	pint		val;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	optlen = sizeof (val);

	if (P_UNLIKELY (getsockopt (socket->fd, SOL_SOCKET, SO_ERROR, (ppointer) &val, &optlen) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getsockopt() to get connection status");
		return FALSE;
	}

	if (P_UNLIKELY (val != 0))
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (val),
				     val,
				     "Error in socket layer");

	socket->connected = (val == 0);

	return (val == 0);
}